

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultNamerDisposer.cpp
# Opt level: O2

void __thiscall
ApprovalTests::DefaultNamerDisposer::DefaultNamerDisposer
          (DefaultNamerDisposer *this,NamerCreator *namerCreator)

{
  _Manager_type p_Var1;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type local_40;
  function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()> local_38;
  
  (this->previous_result).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->previous_result)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->previous_result).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->previous_result).super__Function_base._M_functor + 8) = 0;
  DefaultNamerFactory::getDefaultNamer();
  ::std::function<std::shared_ptr<ApprovalTests::ApprovalNamer>_()>::operator=
            (&this->previous_result,&local_38);
  ::std::_Function_base::~_Function_base(&local_38.super__Function_base);
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = (_Manager_type)0x0;
  local_40 = namerCreator->_M_invoker;
  p_Var1 = (namerCreator->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_58._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(namerCreator->super__Function_base)._M_functor;
    local_58._8_8_ = *(undefined8 *)((long)&(namerCreator->super__Function_base)._M_functor + 8);
    (namerCreator->super__Function_base)._M_manager = (_Manager_type)0x0;
    namerCreator->_M_invoker = (_Invoker_type)0x0;
    local_48 = p_Var1;
  }
  DefaultNamerFactory::setDefaultNamer((NamerCreator *)&local_58);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_58);
  return;
}

Assistant:

DefaultNamerDisposer::DefaultNamerDisposer(NamerCreator namerCreator)
    {
        previous_result = DefaultNamerFactory::getDefaultNamer();
        DefaultNamerFactory::setDefaultNamer(std::move(namerCreator));
    }